

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

String xmrig::OclLib::getProgramBuildLog(cl_program program,cl_device_id device)

{
  cl_int cVar1;
  String *this;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar2;
  String *in_RDI;
  cl_program str;
  String SVar3;
  char *log;
  size_t size;
  size_t *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  String *pSVar4;
  cl_device_id in_stack_ffffffffffffffd8;
  String *pSVar5;
  cl_program program_00;
  
  program_00 = (cl_program)0x0;
  pSVar4 = in_RDI;
  cVar1 = getProgramBuildInfo((cl_program)0x0,in_stack_ffffffffffffffd8,
                              (cl_program_build_info)((ulong)in_RDI >> 0x20),(size_t)in_RDI,
                              in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (cVar1 == 0) {
    str = program_00 + 1;
    this = (String *)operator_new__((ulong)str);
    memset(this,0,(size_t)str);
    pSVar5 = this;
    cVar1 = getProgramBuildInfo(program_00,(cl_device_id)this,
                                (cl_program_build_info)((ulong)pSVar4 >> 0x20),(size_t)in_RDI,this,
                                (size_t *)str);
    if (cVar1 == 0) {
      String::String(this,(char *)str);
      sVar2 = extraout_RDX_01;
    }
    else {
      if (pSVar5 != (String *)0x0) {
        operator_delete__(pSVar5);
      }
      memset(in_RDI,0,0x10);
      String::String(in_RDI);
      sVar2 = extraout_RDX_00;
    }
  }
  else {
    memset(in_RDI,0,0x10);
    String::String(in_RDI);
    sVar2 = extraout_RDX;
  }
  SVar3.m_size = sVar2;
  SVar3.m_data = (char *)pSVar4;
  return SVar3;
}

Assistant:

xmrig::String xmrig::OclLib::getProgramBuildLog(cl_program program, cl_device_id device) noexcept
{
    size_t size = 0;
    if (getProgramBuildInfo(program, device, CL_PROGRAM_BUILD_LOG, 0, nullptr, &size) != CL_SUCCESS) {
        return String();
    }

    char *log = new char[size + 1]();

    if (getProgramBuildInfo(program, device, CL_PROGRAM_BUILD_LOG, size, log, nullptr) != CL_SUCCESS) {
        delete [] log;
        return String();
    }

    return log;
}